

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakMap.cpp
# Opt level: O1

void __thiscall
Js::JavascriptWeakMap::MarkVisitKindSpecificPtrs
          (JavascriptWeakMap *this,SnapshotExtractor *extractor)

{
  int iVar1;
  RecyclableObject *pRVar2;
  bool bVar3;
  JavascriptWeakMap *pJVar4;
  JavascriptWeakMap *this_00;
  int iVar5;
  int iVar6;
  Var local_70;
  Var value;
  ScriptContext *local_60;
  RecyclableObject *local_58;
  JavascriptWeakMap *local_50;
  RecyclableObject *local_48;
  ulong local_40;
  RecyclableObject *local_38;
  Var value_1;
  
  local_60 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  this_00 = this;
  value = extractor;
  if ((local_60->TTDReplayModeEnabled == true) &&
     ((this->keySet).
      super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
      .bucketCount != 0)) {
    local_50 = (JavascriptWeakMap *)&this->keySet;
    local_58 = (RecyclableObject *)((ulong)this | 1);
    local_40 = 0;
    do {
      iVar6 = (this->keySet).
              super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
              .buckets.ptr[local_40];
      if (iVar6 != -1) {
        iVar5 = -1;
        do {
          pRVar2 = (this->keySet).
                   super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                   .weakRefs.ptr[iVar6].ptr;
          if (pRVar2 == (RecyclableObject *)0x0) {
            iVar1 = (this->keySet).
                    super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    .entries.ptr[iVar6].super_ValueEntryData<bool>.next;
            this_00 = local_50;
            JsUtil::
            SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
            ::RemoveAt((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                        *)local_50,iVar6,iVar5,(uint)local_40);
          }
          else {
            local_70 = (Var)0x0;
            pJVar4 = (JavascriptWeakMap *)GetWeakMapKeyMapFromKey(this_00,pRVar2);
            if (pJVar4 != (JavascriptWeakMap *)0x0) {
              local_38 = local_58;
              this_00 = pJVar4;
              bVar3 = JsUtil::
                      BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      ::ContainsKey((BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                                     *)pJVar4,&local_38);
              if (bVar3) {
                KeyMapGet(this,(WeakMapKeyMap *)pJVar4,&local_70);
                local_48 = pRVar2;
                this_00 = (JavascriptWeakMap *)
                          Memory::
                          RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                          ::operator->(&local_60->TTDContextInfo->TTDWeakReferencePinSet);
                local_38 = local_48;
                JsUtil::
                BaseDictionary<Js::RecyclableObject*,Js::RecyclableObject*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                ::
                Insert<(JsUtil::BaseDictionary<Js::RecyclableObject*,Js::RecyclableObject*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                          ((BaseDictionary<Js::RecyclableObject*,Js::RecyclableObject*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                            *)this_00,&local_38,&local_48);
              }
            }
            iVar1 = (this->keySet).
                    super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    .entries.ptr[iVar6].super_ValueEntryData<bool>.next;
            iVar5 = iVar6;
          }
          iVar6 = iVar1;
        } while (iVar6 != -1);
      }
      local_40 = local_40 + 1;
    } while (local_40 <
             (this->keySet).
             super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
             .bucketCount);
  }
  if ((this->keySet).
      super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
      .bucketCount != 0) {
    local_50 = (JavascriptWeakMap *)&this->keySet;
    local_58 = (RecyclableObject *)((ulong)this | 1);
    local_40 = 0;
    do {
      iVar6 = (this->keySet).
              super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
              .buckets.ptr[local_40];
      if (iVar6 != -1) {
        iVar5 = -1;
        do {
          pRVar2 = (this->keySet).
                   super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                   .weakRefs.ptr[iVar6].ptr;
          if (pRVar2 == (RecyclableObject *)0x0) {
            iVar1 = (this->keySet).
                    super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    .entries.ptr[iVar6].super_ValueEntryData<bool>.next;
            this_00 = local_50;
            JsUtil::
            SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
            ::RemoveAt((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                        *)local_50,iVar6,iVar5,(uint)local_40);
          }
          else {
            local_38 = (RecyclableObject *)0x0;
            pJVar4 = (JavascriptWeakMap *)GetWeakMapKeyMapFromKey(this_00,pRVar2);
            if (pJVar4 != (JavascriptWeakMap *)0x0) {
              local_48 = local_58;
              this_00 = pJVar4;
              bVar3 = JsUtil::
                      BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      ::ContainsKey((BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                                     *)pJVar4,&local_48);
              if (bVar3) {
                KeyMapGet(this,(WeakMapKeyMap *)pJVar4,&local_38);
                this_00 = (JavascriptWeakMap *)value;
                TTD::SnapshotExtractor::MarkVisitVar((SnapshotExtractor *)value,local_38);
              }
            }
            iVar1 = (this->keySet).
                    super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    .entries.ptr[iVar6].super_ValueEntryData<bool>.next;
            iVar5 = iVar6;
          }
          iVar6 = iVar1;
        } while (iVar6 != -1);
      }
      local_40 = local_40 + 1;
    } while (local_40 <
             (this->keySet).
             super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
             .bucketCount);
  }
  return;
}

Assistant:

void JavascriptWeakMap::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
    {
        //All weak things should be reachable from another root so no need to mark but do need to repopulate the pin sets if in replay mode
        Js::ScriptContext* scriptContext = this->GetScriptContext();
        if(scriptContext->IsTTDReplayModeEnabled())
        {
            this->Map([&](RecyclableObject* key, Js::Var value)
            {
                scriptContext->TTDContextInfo->TTDWeakReferencePinSet->AddNew(key);
            });
        }

        //Keys are weak so are always reachable from somewhere else but values are not so we must walk them
        this->Map([&](RecyclableObject* key, Js::Var value)
        {
            extractor->MarkVisitVar(value);
        });
    }